

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O1

iterator __thiscall JetHead::list<Selector::ListenerNode_*>::iterator::erase(iterator *this)

{
  void *pvVar1;
  Node *pNVar2;
  long *in_RSI;
  Node *pNVar3;
  
  pvVar1 = (void *)*in_RSI;
  if (((pvVar1 == (void *)0x0) || (pNVar3 = *(Node **)((long)pvVar1 + 8), pNVar3 == (Node *)0x0)) ||
     (pNVar2 = *(Node **)((long)pvVar1 + 0x10), pNVar2 == (Node *)0x0)) {
    pNVar3 = (Node *)*in_RSI;
  }
  else {
    pNVar2->next = pNVar3;
    pNVar3->prev = pNVar2;
    operator_delete(pvVar1,0x18);
    *in_RSI = 0;
  }
  this->mNode = pNVar3;
  return (iterator)(Node *)this;
}

Assistant:

iterator erase()
			{
				// Don't segfault, and don't delete head or tail
				// placeholder nodes 
				if (mNode == NULL or 
					mNode->next == NULL or 
					mNode->prev == NULL) 
				{
					return *this;
				}

				Node* prev = mNode->prev;
				Node* next = mNode->next;

				prev->next = next;
				next->prev = prev;

				delete mNode;
				mNode = NULL;

				iterator ret;
				ret.mNode = next;
				return ret;
			}